

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void VP8LClear(VP8LDecoder *dec)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  if (in_RDI != 0) {
    ClearMetadata((VP8LMetadata *)0x114e37);
    WebPSafeFree((void *)0x114e45);
    *(undefined8 *)(in_RDI + 0x18) = 0;
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x110); local_c = local_c + 1) {
      ClearTransform((VP8LTransform *)0x114e88);
    }
    *(undefined4 *)(in_RDI + 0x110) = 0;
    *(undefined4 *)(in_RDI + 0x178) = 0;
    WebPSafeFree((void *)0x114ec4);
    *(undefined8 *)(in_RDI + 0x180) = 0;
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  return;
}

Assistant:

static void VP8LClear(VP8LDecoder* const dec) {
  int i;
  if (dec == NULL) return;
  ClearMetadata(&dec->hdr_);

  WebPSafeFree(dec->pixels_);
  dec->pixels_ = NULL;
  for (i = 0; i < dec->next_transform_; ++i) {
    ClearTransform(&dec->transforms_[i]);
  }
  dec->next_transform_ = 0;
  dec->transforms_seen_ = 0;

  WebPSafeFree(dec->rescaler_memory);
  dec->rescaler_memory = NULL;

  dec->output_ = NULL;   // leave no trace behind
}